

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O0

int sptk::world::anon_unknown_2::DetectOfficialF0CandidatesSub1
              (int *vuv,int number_of_channels,int *st,int *ed)

{
  int iVar1;
  int iVar2;
  int i;
  int tmp;
  int number_of_voiced_sections;
  int *ed_local;
  int *st_local;
  int number_of_channels_local;
  int *vuv_local;
  
  number_of_voiced_sections = 0;
  for (i = 1; i < number_of_channels; i = i + 1) {
    iVar1 = vuv[i];
    iVar2 = vuv[i + -1];
    if (iVar1 - iVar2 == 1) {
      st[number_of_voiced_sections] = i;
    }
    if (iVar1 - iVar2 == -1) {
      ed[number_of_voiced_sections] = i;
      number_of_voiced_sections = number_of_voiced_sections + 1;
    }
  }
  return number_of_voiced_sections;
}

Assistant:

static int DetectOfficialF0CandidatesSub1(const int *vuv,
    int number_of_channels, int *st, int *ed) {
  int number_of_voiced_sections = 0;
  int tmp;
  for (int i = 1; i < number_of_channels; ++i) {
    tmp = vuv[i] - vuv[i - 1];
    if (tmp == 1) st[number_of_voiced_sections] = i;
    if (tmp == -1) ed[number_of_voiced_sections++] = i;
  }

  return number_of_voiced_sections;
}